

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
* __thiscall
cmGlobalGhsMultiGenerator::GenerateBuildCommand
          (vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           *__return_storage_ptr__,cmGlobalGhsMultiGenerator *this,string *makeProgram,
          string *projectName,string *projectDir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targetNames,string *param_5,int jobs,bool verbose,cmBuildOptions *param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  pointer pcVar1;
  pointer pbVar2;
  uint __val;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  *pvVar3;
  uint uVar4;
  int iVar5;
  undefined8 *puVar6;
  long *plVar7;
  reference pvVar8;
  reference extraout_RAX;
  undefined4 extraout_var;
  uint uVar9;
  size_type *psVar10;
  ulong uVar11;
  pointer pcVar12;
  pointer pbVar13;
  uint __len;
  initializer_list<cmGlobalGenerator::GeneratedMakeCommand> __l;
  string __str;
  GeneratedMakeCommand makeCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  undefined1 local_e8 [24];
  undefined1 uStack_d0;
  undefined7 uStack_cf;
  string local_c0;
  allocator<char> local_9d;
  uint local_9c;
  pointer *local_98;
  long local_90;
  pointer local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined1 uStack_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  cmGlobalGhsMultiGenerator *local_40;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  *local_38;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  uStack_60 = 0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_e8._0_8_ = local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
  cmGlobalGenerator::SelectMakeProgram
            (&local_c0,&this->super_cmGlobalGenerator,makeProgram,(string *)local_e8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
             &local_c0);
  local_40 = this;
  local_38 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  if (jobs != -1) {
    if (jobs == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 (char (*) [10])0x7c4dc4);
    }
    else {
      local_e8._0_8_ = local_e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"-parallel=","");
      __val = -jobs;
      if (0 < jobs) {
        __val = jobs;
      }
      __len = 1;
      if (9 < __val) {
        uVar11 = (ulong)__val;
        uVar4 = 4;
        do {
          __len = uVar4;
          uVar9 = (uint)uVar11;
          if (uVar9 < 100) {
            __len = __len - 2;
            goto LAB_003b2a56;
          }
          if (uVar9 < 1000) {
            __len = __len - 1;
            goto LAB_003b2a56;
          }
          if (uVar9 < 10000) goto LAB_003b2a56;
          uVar11 = uVar11 / 10000;
          uVar4 = __len + 4;
        } while (99999 < uVar9);
        __len = __len + 1;
      }
LAB_003b2a56:
      local_98 = local_88;
      std::__cxx11::string::_M_construct((ulong)&local_98,(char)__len - (char)(jobs >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)((uint)jobs >> 0x1f) + (long)local_98),__len,__val);
      pcVar1 = (pointer)((long)&((_Alloc_hider *)local_e8._8_8_)->_M_p + local_90);
      pcVar12 = (pointer)0xf;
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        pcVar12 = (pointer)local_e8._16_8_;
      }
      if (pcVar12 < pcVar1) {
        pcVar12 = (pointer)0xf;
        if (local_98 != local_88) {
          pcVar12 = local_88[0];
        }
        if (pcVar12 < pcVar1) goto LAB_003b2ad4;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,local_e8._0_8_);
      }
      else {
LAB_003b2ad4:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_e8,(ulong)local_98);
      }
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_c0.field_2._M_allocated_capacity = *psVar10;
        local_c0.field_2._8_8_ = puVar6[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar10;
        local_c0._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_c0._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 &local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,(ulong)(local_88[0] + 1));
      }
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
      }
    }
  }
  pvVar8 = (reference)(local_e8 + 0x10);
  pcVar1 = (projectName->_M_dataplus)._M_p;
  local_e8._0_8_ = pvVar8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,pcVar1,pcVar1 + projectName->_M_string_length);
  std::__cxx11::string::append(local_e8);
  plVar7 = (long *)std::__cxx11::string::append(local_e8);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_c0.field_2._M_allocated_capacity = *psVar10;
    local_c0.field_2._8_8_ = plVar7[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar10;
    local_c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((reference)local_e8._0_8_ != pvVar8) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._0_8_ = pvVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,".*\\.top\\.gpj","");
  cmSystemTools::Glob(projectDir,(string *)local_e8,&local_58);
  if ((reference)local_e8._0_8_ != pvVar8) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)&local_c0);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[5]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
             (char (*) [5])"-top");
  pvVar8 = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           emplace_back<std::__cxx11::string&>
                     ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78
                      ,&local_c0);
  pbVar13 = (targetNames->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (targetNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 != pbVar2) {
    local_9c = 0;
    do {
      while (pbVar13->_M_string_length == 0) {
        pbVar13 = pbVar13 + 1;
        pvVar8 = (reference)CONCAT71((int7)((ulong)pvVar8 >> 8),1);
        local_9c = (uint)pvVar8;
        if (pbVar13 == pbVar2) goto LAB_003b2d78;
      }
      iVar5 = std::__cxx11::string::compare((char *)pbVar13);
      if (iVar5 == 0) {
        pvVar8 = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 emplace_back<char_const(&)[7]>
                           ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            &local_78,(char (*) [7])"-clean");
      }
      else {
        local_e8._0_8_ = local_e8 + 0x10;
        pcVar1 = (pbVar13->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e8,pcVar1,pcVar1 + pbVar13->_M_string_length);
        std::__cxx11::string::append(local_e8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
        pvVar8 = (reference)(local_e8 + 0x10);
        if ((reference)local_e8._0_8_ != pvVar8) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
          pvVar8 = extraout_RAX;
        }
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar2);
    if ((local_9c & 1) == 0) goto LAB_003b2e2f;
  }
LAB_003b2d78:
  iVar5 = (*(local_40->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1b])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,(char *)CONCAT44(extraout_var,iVar5),&local_9d);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
  pvVar8 = (reference)(plVar7 + 2);
  if ((reference)*plVar7 == pvVar8) {
    local_e8._16_8_ = (pvVar8->_M_dataplus)._M_p;
    _uStack_d0 = plVar7[3];
    local_e8._0_8_ = (reference)(local_e8 + 0x10);
  }
  else {
    local_e8._16_8_ = (pvVar8->_M_dataplus)._M_p;
    local_e8._0_8_ = (reference)*plVar7;
  }
  local_e8._8_8_ = plVar7[1];
  *plVar7 = (long)pvVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_98 != local_88) {
    operator_delete(local_98,(ulong)(local_88[0] + 1));
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  if ((reference)local_e8._0_8_ != (reference)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
LAB_003b2e2f:
  if (verbose) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[10]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
               (char (*) [10])0x7c8a9e);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
             CONCAT71(local_78.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                      local_78.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_1_),
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  pvVar3 = local_38;
  local_e8._8_8_ =
       CONCAT71(local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  local_e8._0_8_ =
       local_78.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e8._16_8_ =
       CONCAT71(local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  uStack_d0 = uStack_60;
  __l._M_len = 1;
  __l._M_array = (iterator)local_e8;
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::vector(local_38,__l,(allocator_type *)&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return pvVar3;
}

Assistant:

std::vector<cmGlobalGenerator::GeneratedMakeCommand>
cmGlobalGhsMultiGenerator::GenerateBuildCommand(
  const std::string& makeProgram, const std::string& projectName,
  const std::string& projectDir, std::vector<std::string> const& targetNames,
  const std::string& /*config*/, int jobs, bool verbose,
  const cmBuildOptions& /*buildOptions*/,
  std::vector<std::string> const& makeOptions)
{
  GeneratedMakeCommand makeCommand;

  makeCommand.Add(this->SelectMakeProgram(makeProgram));

  if (jobs != cmake::NO_BUILD_PARALLEL_LEVEL) {
    if (jobs == cmake::DEFAULT_BUILD_PARALLEL_LEVEL) {
      makeCommand.Add("-parallel");
    } else {
      makeCommand.Add(std::string("-parallel=") + std::to_string(jobs));
    }
  }

  /* determine the top-project file in the project directory */
  std::string proj = projectName + ".top" + FILE_EXTENSION;
  std::vector<std::string> files;
  cmSystemTools::Glob(projectDir, ".*\\.top\\.gpj", files);
  if (!files.empty()) {
    /* use the real top-level project in the directory */
    proj = files.at(0);
  }
  makeCommand.Add("-top", proj);

  /* determine targets to build */
  bool build_all = false;
  if (!targetNames.empty()) {
    for (const auto& tname : targetNames) {
      if (!tname.empty()) {
        if (tname == "clean") {
          makeCommand.Add("-clean");
        } else {
          makeCommand.Add(tname + ".tgt.gpj");
        }
      } else {
        build_all = true;
      }
    }
  } else {
    build_all = true;
  }

  if (build_all) {
    /* transform name to default build */;
    std::string all = std::string(this->GetAllTargetName()) + ".tgt.gpj";
    makeCommand.Add(all);
  }

  if (verbose) {
    makeCommand.Add("-commands");
  }
  makeCommand.Add(makeOptions.begin(), makeOptions.end());

  return { std::move(makeCommand) };
}